

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O0

iterator __thiscall KDIS::DATA_TYPE::Mine::getWire(Mine *this,KUINT16 Index)

{
  bool bVar1;
  KException *this_00;
  allocator<char> local_49;
  KString local_48;
  _Self local_28;
  KUINT16 local_1a;
  Mine *pMStack_18;
  KUINT16 Index_local;
  Mine *this_local;
  iterator itr;
  
  local_1a = Index;
  pMStack_18 = this;
  this_local = (Mine *)std::
                       map<unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>_>
                       ::find(&this->m_mvVertices,&local_1a);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>_>
       ::end(&this->m_mvVertices);
  bVar1 = std::operator==((_Self *)&this_local,&local_28);
  if (!bVar1) {
    return (iterator)(_Base_ptr)this_local;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"getWire",&local_49);
  KException::KException<char_const*>(this_00,&local_48,7,"Invalid Wire Index.");
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

map<KUINT16, vector<Vector> >::iterator Mine::getWire(KUINT16 Index) noexcept(false)
{
    map< KUINT16, vector<Vector> >::iterator itr = m_mvVertices.find( Index );
    if( itr == m_mvVertices.end() )throw KException( __FUNCTION__, OUT_OF_BOUNDS, "Invalid Wire Index." );
    return itr;
}